

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LedgerFormats.cpp
# Opt level: O1

void __thiscall jbcoin::LedgerFormats::addCommonFields(LedgerFormats *this,Item *item)

{
  SOElement local_40;
  SOElement local_30;
  SOElement local_20;
  
  local_20.e_field = (SField *)sfLedgerIndex;
  local_20.flags = SOE_OPTIONAL;
  SOTemplate::push_back(&item->elements,&local_20);
  local_30.e_field = (SField *)&sfLedgerEntryType;
  local_30.flags = SOE_REQUIRED;
  SOTemplate::push_back(&item->elements,&local_30);
  local_40.e_field = (SField *)sfFlags;
  local_40.flags = SOE_REQUIRED;
  SOTemplate::push_back(&item->elements,&local_40);
  return;
}

Assistant:

void LedgerFormats::addCommonFields (Item& item)
{
    item
        << SOElement(sfLedgerIndex,             SOE_OPTIONAL)
        << SOElement(sfLedgerEntryType,         SOE_REQUIRED)
        << SOElement(sfFlags,                   SOE_REQUIRED)
        ;
}